

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O2

int libssh2_channel_x11_req_ex
              (LIBSSH2_CHANNEL *channel,int single_connection,char *auth_proto,char *auth_cookie,
              int screen_number)

{
  uchar uVar1;
  libssh2_nonblocking_states lVar2;
  LIBSSH2_SESSION *session;
  int iVar3;
  int errcode;
  size_t len;
  size_t __n;
  uchar *puVar4;
  char *errmsg;
  size_t sVar5;
  long lVar6;
  uchar *local_88;
  uint32_t local_7c;
  uchar *local_78;
  char *local_70;
  char *local_68;
  packet_requirev_state_t *local_60;
  time_t local_58;
  uchar *local_50;
  uchar buffer [17];
  
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    iVar3 = -0x27;
  }
  else {
    local_7c = screen_number;
    local_70 = auth_cookie;
    local_58 = time((time_t *)0x0);
    local_68 = "MIT-MAGIC-COOKIE-1";
    if (auth_proto != (char *)0x0) {
      local_68 = auth_proto;
    }
    local_60 = &channel->reqX11_packet_requirev_state;
    local_78 = channel->reqX11_local_channel;
    do {
      session = channel->session;
      len = 0x12;
      if (auth_proto != (char *)0x0) {
        len = strlen(auth_proto);
      }
      __n = 0x20;
      if (local_70 != (char *)0x0) {
        __n = strlen(local_70);
      }
      lVar2 = channel->reqX11_state;
      if (lVar2 == libssh2_NB_state_sent) {
LAB_0010ae92:
        errcode = _libssh2_packet_requirev
                            (session,"cd",&local_50,(size_t *)buffer,1,local_78,4,local_60);
        iVar3 = -0x25;
        if (errcode != -0x25) {
          if ((errcode == 0) && (buffer._0_8_ != 0)) {
            uVar1 = *local_50;
            (*session->free)(local_50,&session->abstract);
            channel->reqX11_state = libssh2_NB_state_idle;
            if (uVar1 == 'c') {
              return 0;
            }
LAB_0010aef8:
            iVar3 = -0x16;
            errmsg = "Unable to complete request for channel x11-req";
            goto LAB_0010af7f;
          }
          channel->reqX11_state = libssh2_NB_state_idle;
          iVar3 = _libssh2_error(session,errcode,"waiting for x11-req response packet");
        }
LAB_0010af87:
        if (iVar3 != -0x25) {
          return iVar3;
        }
      }
      else {
        if (lVar2 != libssh2_NB_state_created) {
          if (lVar2 != libssh2_NB_state_idle) goto LAB_0010aef8;
          sVar5 = __n + len + 0x1e;
          channel->reqX11_packet_len = sVar5;
          (channel->reqX11_packet_requirev_state).start = 0;
          puVar4 = (uchar *)(*session->alloc)(sVar5,&session->abstract);
          channel->reqX11_packet = puVar4;
          if (puVar4 != (uchar *)0x0) {
            local_88 = puVar4 + 1;
            *puVar4 = 'b';
            _libssh2_store_u32(&local_88,(channel->remote).id);
            _libssh2_store_str(&local_88,"x11-req",7);
            puVar4 = local_88 + 1;
            *local_88 = '\x01';
            local_88 = local_88 + 2;
            *puVar4 = single_connection != 0;
            _libssh2_store_str(&local_88,local_68,len);
            _libssh2_store_u32(&local_88,(uint32_t)__n);
            if (local_70 == (char *)0x0) {
              iVar3 = _libssh2_openssl_random(buffer,0x10);
              if (iVar3 != 0) {
                iVar3 = -0x31;
                errmsg = "Unable to get random bytes for x11-req cookie";
                goto LAB_0010af7f;
              }
              for (lVar6 = 0; lVar6 != 0x20; lVar6 = lVar6 + 2) {
                snprintf((char *)(local_88 + lVar6),3,"%02X");
              }
            }
            else {
              memcpy(local_88,local_70,__n);
            }
            local_88 = local_88 + __n;
            _libssh2_store_u32(&local_88,local_7c);
            channel->reqX11_state = libssh2_NB_state_created;
            goto LAB_0010ae1a;
          }
          iVar3 = -6;
          errmsg = "Unable to allocate memory for pty-request";
LAB_0010af7f:
          iVar3 = _libssh2_error(session,iVar3,errmsg);
          goto LAB_0010af87;
        }
LAB_0010ae1a:
        iVar3 = _libssh2_transport_send
                          (session,channel->reqX11_packet,channel->reqX11_packet_len,(uchar *)0x0,0)
        ;
        if (iVar3 == 0) {
          (*session->free)(channel->reqX11_packet,&session->abstract);
          channel->reqX11_packet = (uchar *)0x0;
          _libssh2_htonu32(local_78,(channel->local).id);
          channel->reqX11_state = libssh2_NB_state_sent;
          goto LAB_0010ae92;
        }
        if (iVar3 != -0x25) {
          (*session->free)(channel->reqX11_packet,&session->abstract);
          channel->reqX11_packet = (uchar *)0x0;
          channel->reqX11_state = libssh2_NB_state_idle;
          errmsg = "Unable to send x11-req packet";
          goto LAB_0010af7f;
        }
        _libssh2_error(session,-0x25,"Would block sending X11-req packet");
      }
      if (channel->session->api_block_mode == 0) {
        return -0x25;
      }
      iVar3 = _libssh2_wait_socket(channel->session,local_58);
    } while (iVar3 == 0);
  }
  return iVar3;
}

Assistant:

LIBSSH2_API int
libssh2_channel_x11_req_ex(LIBSSH2_CHANNEL *channel, int single_connection,
                           const char *auth_proto, const char *auth_cookie,
                           int screen_number)
{
    int rc;

    if(!channel)
        return LIBSSH2_ERROR_BAD_USE;

    BLOCK_ADJUST(rc, channel->session,
                 channel_x11_req(channel, single_connection, auth_proto,
                                 auth_cookie, screen_number));
    return rc;
}